

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vpm.cc
# Opt level: O3

X509_VERIFY_PARAM * X509_VERIFY_PARAM_lookup(char *name)

{
  int iVar1;
  X509_VERIFY_PARAM *pXVar2;
  
  iVar1 = strcmp(name,"default");
  if (iVar1 == 0) {
    pXVar2 = &kDefaultParam;
  }
  else {
    iVar1 = strcmp(name,"pkcs7");
    pXVar2 = &kSMIMESignParam;
    if ((iVar1 != 0) && (iVar1 = strcmp(name,"smime_sign"), iVar1 != 0)) {
      iVar1 = strcmp(name,"ssl_client");
      if (iVar1 == 0) {
        pXVar2 = &kSSLClientParam;
      }
      else {
        iVar1 = strcmp(name,"ssl_server");
        pXVar2 = (X509_VERIFY_PARAM *)0x0;
        if (iVar1 == 0) {
          pXVar2 = &kSSLServerParam;
        }
      }
    }
  }
  return (X509_VERIFY_PARAM *)pXVar2;
}

Assistant:

const X509_VERIFY_PARAM *X509_VERIFY_PARAM_lookup(const char *name) {
  if (strcmp(name, "default") == 0) {
    return &kDefaultParam;
  }
  if (strcmp(name, "pkcs7") == 0) {
    // PKCS#7 and S/MIME signing use the same defaults.
    return &kSMIMESignParam;
  }
  if (strcmp(name, "smime_sign") == 0) {
    return &kSMIMESignParam;
  }
  if (strcmp(name, "ssl_client") == 0) {
    return &kSSLClientParam;
  }
  if (strcmp(name, "ssl_server") == 0) {
    return &kSSLServerParam;
  }
  return NULL;
}